

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.hpp
# Opt level: O0

void __thiscall Simulator::ClockReg<Simulator::WRegX>::tick(ClockReg<Simulator::WRegX> *this)

{
  uint32_t uVar1;
  undefined4 uVar2;
  ClockReg<Simulator::WRegX> *this_local;
  
  if ((this->bubble & 1U) == 0) {
    if ((this->stall & 1U) == 0) {
      uVar1 = (this->in).rd;
      (this->out).opcode = (this->in).opcode;
      (this->out).rd = uVar1;
      (this->out).valE = (this->in).valE;
      (this->out).valM = (this->in).valM;
      uVar2 = *(undefined4 *)&(this->in).field_0x1c;
      (this->out).inst = (this->in).inst;
      *(undefined4 *)&(this->out).field_0x1c = uVar2;
    }
    else {
      this->stall = false;
    }
  }
  else {
    (this->out).opcode = 0;
    (this->out).inst = UNKNOWN;
    this->stall = false;
    this->bubble = false;
  }
  return;
}

Assistant:

void tick() {
            if (bubble) {
                out.opcode = RISCV_GRX::OP_BUBBLE;
                out.inst = RISCV_GRX::UNKNOWN;
                bubble = stall = false;
//                out.stall_count = 0;
            } else if (stall) {
                stall = false;
            } else {
                out = in;
            }
        }